

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_matrix.c
# Opt level: O3

int gdAffineFlip(double *dst,double *src,int flip_h,int flip_v)

{
  double dVar1;
  
  if (flip_h == 0) {
    *dst = *src;
    dVar1 = src[1];
  }
  else {
    *dst = -*src;
    dVar1 = -src[1];
  }
  dst[1] = dVar1;
  if (flip_v == 0) {
    dst[2] = src[2];
    dVar1 = src[3];
  }
  else {
    dst[2] = -src[2];
    dVar1 = -src[3];
  }
  dst[3] = dVar1;
  dVar1 = src[4];
  if (flip_h != 0) {
    dVar1 = -dVar1;
  }
  dst[4] = dVar1;
  dVar1 = src[5];
  if (flip_v != 0) {
    dVar1 = -dVar1;
  }
  dst[5] = dVar1;
  return 1;
}

Assistant:

BGD_DECLARE(int) gdAffineFlip (double dst[6], const double src[6], const int flip_h, const int flip_v)
{
	dst[0] = flip_h ? - src[0] : src[0];
	dst[1] = flip_h ? - src[1] : src[1];
	dst[2] = flip_v ? - src[2] : src[2];
	dst[3] = flip_v ? - src[3] : src[3];
	dst[4] = flip_h ? - src[4] : src[4];
	dst[5] = flip_v ? - src[5] : src[5];
	return GD_TRUE;
}